

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O1

RPCHelpMan * gettxout(void)

{
  ulong *puVar1;
  long *plVar2;
  string name;
  string name_00;
  string name_01;
  string cond;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string cond_00;
  string name_02;
  string m_key_name_08;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string m_key_name_09;
  string description_09;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  string description_10;
  string description_11;
  RPCResults results;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  RPCExamples examples;
  string description_12;
  string description_13;
  string description_14;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  undefined1 auVar3 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  undefined8 uVar9;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  undefined4 in_stack_ffffffffffffebf8;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffebfc;
  undefined1 in_stack_ffffffffffffec00 [16];
  undefined8 in_stack_ffffffffffffec18;
  undefined8 in_stack_ffffffffffffec20;
  undefined8 in_stack_ffffffffffffec28;
  code *pcVar11;
  undefined8 in_stack_ffffffffffffec30;
  undefined1 in_stack_ffffffffffffec38 [16];
  pointer in_stack_ffffffffffffec48;
  pointer pRVar12;
  pointer in_stack_ffffffffffffec50;
  pointer pRVar13;
  pointer in_stack_ffffffffffffec58;
  pointer pRVar14;
  pointer in_stack_ffffffffffffec60;
  pointer in_stack_ffffffffffffec68;
  pointer pRVar15;
  pointer in_stack_ffffffffffffec70;
  pointer pRVar16;
  pointer in_stack_ffffffffffffec78;
  pointer pRVar17;
  undefined8 in_stack_ffffffffffffec80;
  pointer in_stack_ffffffffffffec88;
  pointer in_stack_ffffffffffffec90;
  pointer in_stack_ffffffffffffec98;
  undefined8 in_stack_ffffffffffffeca0;
  pointer in_stack_ffffffffffffeca8;
  pointer in_stack_ffffffffffffecb0;
  pointer in_stack_ffffffffffffecb8;
  undefined8 in_stack_ffffffffffffecc0;
  pointer in_stack_ffffffffffffecc8;
  pointer in_stack_ffffffffffffecd0;
  pointer in_stack_ffffffffffffecd8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1318;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1300;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1290;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1278;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1258;
  allocator_type local_123a;
  bool local_1239;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1238;
  string local_1220;
  string local_1200;
  string local_11e0;
  string local_11c0;
  string local_11a0;
  string local_1180;
  string local_1160;
  string local_1140;
  string local_1120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10a0;
  ulong *local_1080;
  undefined8 local_1078;
  ulong local_1070;
  undefined8 uStack_1068;
  ulong *local_1060;
  size_type local_1058;
  ulong local_1050;
  undefined8 uStack_1048;
  long *local_1040 [2];
  long local_1030 [2];
  long *local_1020 [2];
  long local_1010 [2];
  long *local_1000 [2];
  long local_ff0 [2];
  long *local_fe0 [2];
  long local_fd0 [2];
  long *local_fc0 [2];
  long local_fb0 [2];
  long *local_fa0 [2];
  long local_f90 [2];
  long *local_f80 [2];
  long local_f70 [2];
  long *local_f60 [2];
  long local_f50 [2];
  long *local_f40 [2];
  long local_f30 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_f20;
  long *local_f00 [2];
  long local_ef0 [2];
  pointer local_ee0 [2];
  undefined1 local_ed0 [152];
  RPCResult local_e38;
  RPCResult local_db0;
  RPCResult local_d28;
  RPCResult local_ca0;
  long *local_c18 [2];
  long local_c08 [2];
  long *local_bf8 [2];
  long local_be8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd8;
  long *local_bb8 [2];
  long local_ba8 [2];
  long *local_b98 [2];
  long local_b88 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_b78;
  long *local_b58 [2];
  long local_b48 [2];
  pointer local_b38 [2];
  undefined1 local_b28 [152];
  RPCResult local_a90;
  RPCResult local_a08;
  RPCResult local_980;
  RPCResult local_8f8;
  long *local_870 [2];
  long local_860 [2];
  long *local_850 [2];
  long local_840 [2];
  long *local_830 [2];
  long local_820 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_810;
  long *local_7f0 [2];
  long local_7e0 [2];
  long *local_7d0 [2];
  long local_7c0 [2];
  RPCResult local_7b0;
  RPCResult local_728;
  undefined1 local_6a0;
  undefined1 *local_698;
  undefined8 local_690;
  undefined1 local_688;
  undefined7 uStack_687;
  undefined1 local_678 [32];
  long *local_658 [2];
  long local_648 [2];
  UniValue local_638;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_5e0;
  undefined1 local_588;
  long *local_580 [2];
  long local_570 [2];
  undefined1 local_560;
  undefined1 *local_558;
  undefined8 local_550;
  undefined1 local_548;
  undefined7 uStack_547;
  undefined1 local_538 [32];
  long *local_518 [2];
  long local_508 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4f8;
  undefined1 local_4a0;
  long *local_498 [2];
  long local_488 [2];
  undefined1 local_478;
  vector<RPCArg,_std::allocator<RPCArg>_> local_470;
  undefined1 auStack_458 [8];
  undefined1 local_450 [32];
  long *local_430 [2];
  long local_420 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_410;
  undefined1 local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  RPCArg local_390;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1030[0] = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"gettxout","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"\nReturns details about an unspent transaction output.\n","");
  local_3b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_3b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"txid","");
  local_410._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_3b8 = 0;
  local_430[0] = local_420;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"The transaction id","");
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_478 = 0;
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_450._0_8_ = (pointer)0x0;
  local_450._8_2_ = 0;
  local_450._10_6_ = 0;
  local_450._16_2_ = 0;
  local_450._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebfc;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebf8;
  name._8_16_ = in_stack_ffffffffffffec00;
  name.field_2._8_8_ = in_RDI;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffec20;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffec18;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffec28;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffec30;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffec38;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffec48;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffec50;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffec58;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffec60;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffec68;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffec70;
  description_12._M_string_length = in_stack_ffffffffffffec80;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec78;
  description_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec88;
  description_12.field_2._8_8_ = in_stack_ffffffffffffec90;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeca0;
  opts._0_8_ = in_stack_ffffffffffffec98;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeca8;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffecb0;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffecb8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffecc0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffecc8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffecd0;
  opts._64_8_ = in_stack_ffffffffffffecd8;
  RPCArg::RPCArg(&local_390,name,(Type)&local_3b0,fallback,description_12,opts);
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"n","");
  local_4f8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_4a0 = 0;
  local_518[0] = local_508;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"vout number","");
  local_558 = &local_548;
  local_560 = 0;
  local_550 = 0;
  local_548 = 0;
  local_538._0_8_ = (pointer)0x0;
  local_538._8_2_ = 0;
  local_538._10_6_ = 0;
  local_538._16_2_ = 0;
  local_538._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebfc;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebf8;
  name_00._8_16_ = in_stack_ffffffffffffec00;
  name_00.field_2._8_8_ = in_RDI;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffec20;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffec18;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffec28;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffec30;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffec38;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffec48;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffec50;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffec58;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffec60;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffec68;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffec70;
  description_13._M_string_length = in_stack_ffffffffffffec80;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec78;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec88;
  description_13.field_2._8_8_ = in_stack_ffffffffffffec90;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeca0;
  opts_00._0_8_ = in_stack_ffffffffffffec98;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeca8;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffecb0;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffecb8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffecc0;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffecc8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffecd0;
  opts_00._64_8_ = in_stack_ffffffffffffecd8;
  RPCArg::RPCArg(&local_288,name_00,(Type)local_498,fallback_00,description_13,opts_00);
  local_580[0] = local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"include_mempool","");
  local_1239 = true;
  UniValue::UniValue<bool,_bool,_true>(&local_638,&local_1239);
  paVar7 = &local_638.val.field_2;
  local_5e0._8_8_ = (long)&local_5e0 + 0x18;
  local_5e0._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_638.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638.val._M_dataplus._M_p == paVar7) {
    local_5e0._32_8_ = local_638.val.field_2._8_8_;
  }
  else {
    local_5e0._8_8_ = local_638.val._M_dataplus._M_p;
  }
  local_5e0._16_8_ = local_638.val._M_string_length;
  local_638.val._M_string_length = 0;
  local_638.val.field_2._M_local_buf[0] = '\0';
  local_5e0._40_8_ =
       local_638.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_5e0._48_8_ =
       local_638.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_5e0._56_8_ =
       local_638.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_638.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_638.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_638.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5e0._64_4_ =
       local_638.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_5e0._68_4_ =
       local_638.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_5e0._72_4_ =
       local_638.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_5e0._76_4_ =
       local_638.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_5e0._80_8_ =
       local_638.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_638.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_638.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_638.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_588 = 2;
  local_658[0] = local_648;
  local_638.val._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_658,
             "Whether to include the mempool. Note that an unspent output that is spent in the mempool won\'t appear."
             ,"");
  local_698 = &local_688;
  local_6a0 = 0;
  local_690 = 0;
  local_688 = 0;
  local_678._0_8_ = (pointer)0x0;
  local_678._8_2_ = 0;
  local_678._10_6_ = 0;
  local_678._16_2_ = 0;
  local_678._18_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebfc;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebf8;
  name_01._8_16_ = in_stack_ffffffffffffec00;
  name_01.field_2._8_8_ = in_RDI;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffec20;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffec18;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffec28;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffec30;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffec38;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffec48;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffec50;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffec58;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffec60;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffec68;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffec70;
  description_14._M_string_length = in_stack_ffffffffffffec80;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec78;
  description_14.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec88;
  description_14.field_2._8_8_ = in_stack_ffffffffffffec90;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeca0;
  opts_01._0_8_ = in_stack_ffffffffffffec98;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeca8;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffecb0;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffecb8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffecc0;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffecc8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffecd0;
  opts_01._64_8_ = in_stack_ffffffffffffecd8;
  RPCArg::RPCArg(&local_180,name_01,(Type)local_580,fallback_01,description_14,opts_01);
  __l._M_len = 3;
  __l._M_array = &local_390;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1238,__l,&local_123a);
  local_7d0[0] = local_7c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7d0,"If the UTXO was not found","");
  local_7f0[0] = local_7e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7f0,"");
  local_810.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_810.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"");
  local_1278.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1278.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1278.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cond._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebfc;
  cond._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebf8;
  cond._8_16_ = in_stack_ffffffffffffec00;
  cond.field_2._8_8_ = in_RDI;
  m_key_name_08._M_string_length = in_stack_ffffffffffffec20;
  m_key_name_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec18;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_ffffffffffffec28;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffec30;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffec48;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38._0_8_;
  description_10._M_string_length = in_stack_ffffffffffffec38._8_8_;
  description_10.field_2._8_8_ = in_stack_ffffffffffffec50;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffec60;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffec58;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec68;
  RPCResult::RPCResult(&local_7b0,cond,(Type)local_7d0,m_key_name_08,description_10,inner_09);
  local_830[0] = local_820;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_830,"Otherwise","");
  local_850[0] = local_840;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_850,"");
  local_870[0] = local_860;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_870,"");
  local_b38[0] = (pointer)local_b28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b38,"bestblock","");
  local_b58[0] = local_b48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b58,"The hash of the block at the tip of the chain","");
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebfc;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebf8;
  m_key_name._8_16_ = in_stack_ffffffffffffec00;
  m_key_name.field_2._8_8_ = in_RDI;
  description._M_string_length = in_stack_ffffffffffffec20;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec18;
  description.field_2._M_allocated_capacity = in_stack_ffffffffffffec28;
  description.field_2._8_8_ = in_stack_ffffffffffffec30;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffec48;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffec38._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffec38._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)(local_b28 + 0x10),STR_HEX,m_key_name,description,inner,SUB81(local_b38,0)
            );
  local_b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b78,"confirmations","");
  local_b98[0] = local_b88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b98,"The number of confirmations","");
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebfc;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebf8;
  m_key_name_00._8_16_ = in_stack_ffffffffffffec00;
  m_key_name_00.field_2._8_8_ = in_RDI;
  description_00._M_string_length = in_stack_ffffffffffffec20;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec18;
  description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffec28;
  description_00.field_2._8_8_ = in_stack_ffffffffffffec30;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec48;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec38._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec38._8_8_;
  RPCResult::RPCResult(&local_a90,NUM,m_key_name_00,description_00,inner_00,SUB81(&local_b78,0));
  local_bb8[0] = local_ba8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bb8,"value","");
  std::operator+(&local_bd8,"The transaction value in ",&CURRENCY_UNIT_abi_cxx11_);
  local_12e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebfc;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebf8;
  m_key_name_01._8_16_ = in_stack_ffffffffffffec00;
  m_key_name_01.field_2._8_8_ = in_RDI;
  description_01._M_string_length = in_stack_ffffffffffffec20;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec18;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffec28;
  description_01.field_2._8_8_ = in_stack_ffffffffffffec30;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec48;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec38._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec38._8_8_;
  RPCResult::RPCResult
            (&local_a08,STR_AMOUNT,m_key_name_01,description_01,inner_01,SUB81(local_bb8,0));
  local_bf8[0] = local_be8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bf8,"scriptPubKey","");
  local_c18[0] = local_c08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c18,"");
  local_ee0[0] = (pointer)local_ed0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ee0,"asm","");
  local_f00[0] = local_ef0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f00,"Disassembly of the output script","");
  local_1318.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1318.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1318.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebfc;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebf8;
  m_key_name_02._8_16_ = in_stack_ffffffffffffec00;
  m_key_name_02.field_2._8_8_ = in_RDI;
  description_02._M_string_length = in_stack_ffffffffffffec20;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec18;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffec28;
  description_02.field_2._8_8_ = in_stack_ffffffffffffec30;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec48;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec38._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec38._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)(local_ed0 + 0x10),STR,m_key_name_02,description_02,inner_02,
             SUB81(local_ee0,0));
  local_f20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_f20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f20,"desc","");
  local_f40[0] = local_f30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f40,"Inferred descriptor for the output","");
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebfc;
  m_key_name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebf8;
  m_key_name_03._8_16_ = in_stack_ffffffffffffec00;
  m_key_name_03.field_2._8_8_ = in_RDI;
  description_03._M_string_length = in_stack_ffffffffffffec20;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec18;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffec28;
  description_03.field_2._8_8_ = in_stack_ffffffffffffec30;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec48;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec38._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec38._8_8_;
  RPCResult::RPCResult(&local_e38,STR,m_key_name_03,description_03,inner_03,SUB81(&local_f20,0));
  local_f60[0] = local_f50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f60,"hex","");
  local_f80[0] = local_f70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f80,"The raw output script bytes, hex-encoded","");
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebfc;
  m_key_name_04._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebf8;
  m_key_name_04._8_16_ = in_stack_ffffffffffffec00;
  m_key_name_04.field_2._8_8_ = in_RDI;
  description_04._M_string_length = in_stack_ffffffffffffec20;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec18;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffec28;
  description_04.field_2._8_8_ = in_stack_ffffffffffffec30;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec48;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec38._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec38._8_8_;
  RPCResult::RPCResult(&local_db0,STR_HEX,m_key_name_04,description_04,inner_04,SUB81(local_f60,0));
  local_fa0[0] = local_f90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fa0,"type","");
  local_fc0[0] = local_fb0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fc0,"The type, eg pubkeyhash","");
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebfc;
  m_key_name_05._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebf8;
  m_key_name_05._8_16_ = in_stack_ffffffffffffec00;
  m_key_name_05.field_2._8_8_ = in_RDI;
  description_05._M_string_length = in_stack_ffffffffffffec20;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec18;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffec28;
  description_05.field_2._8_8_ = in_stack_ffffffffffffec30;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec48;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec38._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec38._8_8_;
  RPCResult::RPCResult(&local_d28,STR,m_key_name_05,description_05,inner_05,SUB81(local_fa0,0));
  local_fe0[0] = local_fd0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fe0,"address","");
  local_1000[0] = local_ff0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1000,"The Bitcoin address (only if a well-defined address exists)","");
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  pRVar17 = (pointer)0x0;
  uVar10 = 0;
  auVar3._4_16_ = in_stack_ffffffffffffec00;
  auVar3._0_4_ = in_stack_ffffffffffffebfc;
  auVar3._20_8_ = in_RDI;
  auVar3._28_4_ = 0;
  description_06._M_string_length = in_stack_ffffffffffffec20;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec18;
  description_06.field_2._M_allocated_capacity = in_stack_ffffffffffffec28;
  description_06.field_2._8_8_ = in_stack_ffffffffffffec30;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec48;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec38._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec38._8_8_;
  RPCResult::RPCResult
            (&local_ca0,STR,(string)(auVar3 << 0x20),SUB81(local_fe0,0),description_06,inner_06,true
            );
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)(local_ed0 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1300,__l_00,(allocator_type *)&stack0xffffffffffffec67);
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebfc;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_06._8_16_ = in_stack_ffffffffffffec00;
  m_key_name_06.field_2._8_8_ = in_RDI;
  description_07._M_string_length = in_stack_ffffffffffffec20;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec18;
  description_07.field_2._M_allocated_capacity = in_stack_ffffffffffffec28;
  description_07.field_2._8_8_ = in_stack_ffffffffffffec30;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffec48;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec38._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec38._8_8_;
  RPCResult::RPCResult(&local_980,OBJ,m_key_name_06,description_07,inner_07,SUB81(local_bf8,0));
  local_1020[0] = local_1010;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1020,"coinbase","");
  local_1040[0] = local_1030;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1040,"Coinbase or not","");
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebfc;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_07._8_16_ = in_stack_ffffffffffffec00;
  m_key_name_07.field_2._8_8_ = in_RDI;
  description_08._M_string_length = in_stack_ffffffffffffec20;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec18;
  description_08.field_2._M_allocated_capacity = in_stack_ffffffffffffec28;
  description_08.field_2._8_8_ = in_stack_ffffffffffffec30;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffec38._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffec38._8_8_;
  RPCResult::RPCResult(&local_8f8,BOOL,m_key_name_07,description_08,inner_08,SUB81(local_1020,0));
  __l_01._M_len = 5;
  __l_01._M_array = (iterator)(local_b28 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1290,__l_01,(allocator_type *)&stack0xffffffffffffec47);
  cond_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebfc;
  cond_00._M_dataplus._M_p._0_4_ = uVar10;
  cond_00._8_16_ = in_stack_ffffffffffffec00;
  cond_00.field_2._8_8_ = in_RDI;
  m_key_name_09._M_string_length = in_stack_ffffffffffffec20;
  m_key_name_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec18;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_ffffffffffffec28;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffec30;
  description_11.field_2._M_allocated_capacity = (size_type)pRVar12;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffec38._0_8_;
  description_11._M_string_length = in_stack_ffffffffffffec38._8_8_;
  description_11.field_2._8_8_ = pRVar13;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffec60;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar14;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar15;
  RPCResult::RPCResult(&local_728,cond_00,(Type)local_830,m_key_name_09,description_11,inner_10);
  __l_02._M_len = 2;
  __l_02._M_array = &local_7b0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1258,__l_02,(allocator_type *)&local_10a0);
  local_1140._M_dataplus._M_p = (pointer)&local_1140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1140,"listunspent","");
  local_1160._M_dataplus._M_p = (pointer)&local_1160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1160,"");
  HelpExampleCli(&local_1120,&local_1140,&local_1160);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_1120,0,0,"\nGet unspent transactions\n",0x1a);
  local_1100._M_dataplus._M_p = (pointer)&local_1100.field_2;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if (paVar7 == paVar6) {
    local_1100.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_1100.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_1100.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_1100._M_dataplus._M_p = (pointer)paVar7;
  }
  local_1100._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1100,"\nView the details\n");
  local_10e0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10e0._M_dataplus._M_p == paVar7) {
    local_10e0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_10e0.field_2._8_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 8);
    local_10e0.field_2._12_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 0xc);
    local_10e0._M_dataplus._M_p = (pointer)&local_10e0.field_2;
  }
  else {
    local_10e0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_10e0._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  local_11a0._M_dataplus._M_p = (pointer)&local_11a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_11a0,"gettxout","");
  local_11c0._M_dataplus._M_p = (pointer)&local_11c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_11c0,"\"txid\" 1","");
  HelpExampleCli(&local_1180,&local_11a0,&local_11c0);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10e0._M_dataplus._M_p != &local_10e0.field_2) {
    uVar9 = local_10e0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_1180._M_string_length + local_10e0._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1180._M_dataplus._M_p != &local_1180.field_2) {
      uVar9 = local_1180.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_1180._M_string_length + local_10e0._M_string_length) goto LAB_009cc424;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_1180,0,0,local_10e0._M_dataplus._M_p,local_10e0._M_string_length);
  }
  else {
LAB_009cc424:
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_10e0,local_1180._M_dataplus._M_p,local_1180._M_string_length);
  }
  local_10c0._M_dataplus._M_p = (pointer)&local_10c0.field_2;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if (paVar6 == paVar7) {
    local_10c0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_10c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_10c0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_10c0._M_dataplus._M_p = (pointer)paVar6;
  }
  local_10c0._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_10c0,"\nAs a JSON-RPC call\n");
  local_10a0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10a0._M_dataplus._M_p == paVar7) {
    local_10a0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_10a0.field_2._8_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 8);
    local_10a0.field_2._12_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 0xc);
    local_10a0._M_dataplus._M_p = (pointer)&local_10a0.field_2;
  }
  else {
    local_10a0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_10a0._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  local_1200._M_dataplus._M_p = (pointer)&local_1200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1200,"gettxout","");
  local_1220._M_dataplus._M_p = (pointer)&local_1220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1220,"\"txid\", 1","");
  HelpExampleRpc(&local_11e0,&local_1200,&local_1220);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10a0._M_dataplus._M_p != &local_10a0.field_2) {
    uVar9 = local_10a0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_11e0._M_string_length + local_10a0._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_11e0._M_dataplus._M_p != &local_11e0.field_2) {
      uVar9 = local_11e0.field_2._M_allocated_capacity;
    }
    if (local_11e0._M_string_length + local_10a0._M_string_length <= (ulong)uVar9) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_11e0,0,0,local_10a0._M_dataplus._M_p,local_10a0._M_string_length);
      goto LAB_009cc5ed;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_10a0,local_11e0._M_dataplus._M_p,local_11e0._M_string_length);
LAB_009cc5ed:
  local_1080 = &local_1070;
  puVar1 = (ulong *)(pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 == paVar7) {
    local_1070 = paVar7->_M_allocated_capacity;
    uStack_1068 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_1070 = paVar7->_M_allocated_capacity;
    local_1080 = puVar1;
  }
  local_1058 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  if (local_1080 == &local_1070) {
    uStack_1048 = uStack_1068;
    local_1060 = &local_1050;
  }
  else {
    local_1060 = local_1080;
  }
  local_1050 = local_1070;
  local_1078 = 0;
  local_1070 = local_1070 & 0xffffffffffffff00;
  pcVar11 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:1120:9)>
            ::_M_manager;
  name_02._8_16_ = in_stack_ffffffffffffec00;
  name_02._M_dataplus._M_p = &stack0xffffffffffffec18;
  name_02.field_2._8_8_ = in_RDI;
  description_09.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:1120:9)>
       ::_M_manager;
  description_09._M_dataplus._M_p = (pointer)0x0;
  description_09._M_string_length = 0;
  description_09.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:1120:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar12;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffec38._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffec38._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar14;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar13;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffec60;
  examples.m_examples._M_string_length = (size_type)pRVar16;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar15;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar17;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffec80;
  local_1080 = &local_1070;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name_02,description_09,args,results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar11 != (code *)0x0) {
    (*pcVar11)(&stack0xffffffffffffec18,&stack0xffffffffffffec18,3);
  }
  if (local_1060 != &local_1050) {
    operator_delete(local_1060,local_1050 + 1);
  }
  if (local_1080 != &local_1070) {
    operator_delete(local_1080,local_1070 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11e0._M_dataplus._M_p != &local_11e0.field_2) {
    operator_delete(local_11e0._M_dataplus._M_p,local_11e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1220._M_dataplus._M_p != &local_1220.field_2) {
    operator_delete(local_1220._M_dataplus._M_p,local_1220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1200._M_dataplus._M_p != &local_1200.field_2) {
    operator_delete(local_1200._M_dataplus._M_p,local_1200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10a0._M_dataplus._M_p != &local_10a0.field_2) {
    operator_delete(local_10a0._M_dataplus._M_p,local_10a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10c0._M_dataplus._M_p != &local_10c0.field_2) {
    operator_delete(local_10c0._M_dataplus._M_p,local_10c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1180._M_dataplus._M_p != &local_1180.field_2) {
    operator_delete(local_1180._M_dataplus._M_p,local_1180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11c0._M_dataplus._M_p != &local_11c0.field_2) {
    operator_delete(local_11c0._M_dataplus._M_p,local_11c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11a0._M_dataplus._M_p != &local_11a0.field_2) {
    operator_delete(local_11a0._M_dataplus._M_p,local_11a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10e0._M_dataplus._M_p != &local_10e0.field_2) {
    operator_delete(local_10e0._M_dataplus._M_p,local_10e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1100._M_dataplus._M_p != &local_1100.field_2) {
    operator_delete(local_1100._M_dataplus._M_p,local_1100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1120._M_dataplus._M_p != &local_1120.field_2) {
    operator_delete(local_1120._M_dataplus._M_p,local_1120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1160._M_dataplus._M_p != &local_1160.field_2) {
    operator_delete(local_1160._M_dataplus._M_p,local_1160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1140._M_dataplus._M_p != &local_1140.field_2) {
    operator_delete(local_1140._M_dataplus._M_p,local_1140.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1258);
  lVar8 = 0x110;
  do {
    if ((long *)((long)local_7c0 + lVar8) != *(long **)((long)local_7d0 + lVar8)) {
      operator_delete(*(long **)((long)local_7d0 + lVar8),*(long *)((long)local_7c0 + lVar8) + 1);
    }
    if ((long *)((long)local_7e0 + lVar8) != *(long **)((long)local_7f0 + lVar8)) {
      operator_delete(*(long **)((long)local_7f0 + lVar8),*(long *)((long)local_7e0 + lVar8) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_810.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar8));
    if ((long *)((long)local_820 + lVar8) != *(long **)((long)local_830 + lVar8)) {
      operator_delete(*(long **)((long)local_830 + lVar8),*(long *)((long)local_820 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1290);
  lVar8 = 0x2a8;
  do {
    if ((long *)(local_b28 + lVar8) != *(long **)((long)local_b38 + lVar8)) {
      operator_delete(*(long **)((long)local_b38 + lVar8),*(long *)(local_b28 + lVar8) + 1);
    }
    if ((long *)((long)local_b48 + lVar8) != *(long **)((long)local_b58 + lVar8)) {
      operator_delete(*(long **)((long)local_b58 + lVar8),*(long *)((long)local_b48 + lVar8) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar8));
    if ((long *)((long)local_b88 + lVar8) != *(long **)((long)local_b98 + lVar8)) {
      operator_delete(*(long **)((long)local_b98 + lVar8),*(long *)((long)local_b88 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffec48);
  if (local_1040[0] != local_1030) {
    operator_delete(local_1040[0],local_1030[0] + 1);
  }
  if (local_1020[0] != local_1010) {
    operator_delete(local_1020[0],local_1010[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1300);
  lVar8 = 0x2a8;
  do {
    if ((long *)(local_ed0 + lVar8) != *(long **)((long)local_ee0 + lVar8)) {
      operator_delete(*(long **)((long)local_ee0 + lVar8),*(long *)(local_ed0 + lVar8) + 1);
    }
    if ((long *)((long)local_ef0 + lVar8) != *(long **)((long)local_f00 + lVar8)) {
      operator_delete(*(long **)((long)local_f00 + lVar8),*(long *)((long)local_ef0 + lVar8) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_f20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar8));
    if ((long *)((long)local_f30 + lVar8) != *(long **)((long)local_f40 + lVar8)) {
      operator_delete(*(long **)((long)local_f40 + lVar8),*(long *)((long)local_f30 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffec68);
  if (local_1000[0] != local_ff0) {
    operator_delete(local_1000[0],local_ff0[0] + 1);
  }
  if (local_fe0[0] != local_fd0) {
    operator_delete(local_fe0[0],local_fd0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffec88);
  if (local_fc0[0] != local_fb0) {
    operator_delete(local_fc0[0],local_fb0[0] + 1);
  }
  if (local_fa0[0] != local_f90) {
    operator_delete(local_fa0[0],local_f90[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeca8);
  if (local_f80[0] != local_f70) {
    operator_delete(local_f80[0],local_f70[0] + 1);
  }
  if (local_f60[0] != local_f50) {
    operator_delete(local_f60[0],local_f50[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffecc8);
  if (local_f40[0] != local_f30) {
    operator_delete(local_f40[0],local_f30[0] + 1);
  }
  if (local_f20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_f20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_f20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_f20.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1318);
  if (local_f00[0] != local_ef0) {
    operator_delete(local_f00[0],local_ef0[0] + 1);
  }
  if (local_ee0[0] != (pointer)local_ed0) {
    operator_delete(local_ee0[0],local_ed0._0_8_ + 1);
  }
  if (local_c18[0] != local_c08) {
    operator_delete(local_c18[0],local_c08[0] + 1);
  }
  if (local_bf8[0] != local_be8) {
    operator_delete(local_bf8[0],local_be8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd8._M_dataplus._M_p != &local_bd8.field_2) {
    operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
  }
  if (local_bb8[0] != local_ba8) {
    operator_delete(local_bb8[0],local_ba8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12c8);
  if (local_b98[0] != local_b88) {
    operator_delete(local_b98[0],local_b88[0] + 1);
  }
  if (local_b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_b78.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12a8);
  if (local_b58[0] != local_b48) {
    operator_delete(local_b58[0],local_b48[0] + 1);
  }
  if (local_b38[0] != (pointer)local_b28) {
    operator_delete(local_b38[0],local_b28._0_8_ + 1);
  }
  if (local_870[0] != local_860) {
    operator_delete(local_870[0],local_860[0] + 1);
  }
  if (local_850[0] != local_840) {
    operator_delete(local_850[0],local_840[0] + 1);
  }
  if (local_830[0] != local_820) {
    operator_delete(local_830[0],local_820[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1278);
  if (local_810.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_810.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_810.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_810.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  if (local_7f0[0] != local_7e0) {
    operator_delete(local_7f0[0],local_7e0[0] + 1);
  }
  if (local_7d0[0] != local_7c0) {
    operator_delete(local_7d0[0],local_7c0[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1238);
  lVar8 = 0x318;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_3b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar8));
    plVar2 = *(long **)((long)&local_410 + lVar8 + 0x40);
    plVar5 = (long *)((long)&local_410 + lVar8 + 0x50);
    if (plVar5 != plVar2) {
      operator_delete(plVar2,*plVar5 + 1);
    }
    plVar5 = (long *)((long)&local_410 + lVar8 + 0x28);
    plVar2 = *(long **)((long)&local_410 + lVar8 + 0x18);
    if (plVar5 != plVar2) {
      operator_delete(plVar2,*plVar5 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_458 + lVar8));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + lVar8
               ));
    if ((long *)((long)local_488 + lVar8) != *(long **)((long)local_498 + lVar8)) {
      operator_delete(*(long **)((long)local_498 + lVar8),*(long *)((long)local_488 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x108;
  } while (lVar8 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_678);
  if (local_698 != &local_688) {
    operator_delete(local_698,CONCAT71(uStack_687,local_688) + 1);
  }
  if (local_658[0] != local_648) {
    operator_delete(local_658[0],local_648[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_5e0._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_638.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_638.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638.val._M_dataplus._M_p != &local_638.val.field_2) {
    operator_delete(local_638.val._M_dataplus._M_p,
                    CONCAT71(local_638.val.field_2._M_allocated_capacity._1_7_,
                             local_638.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_580[0] != local_570) {
    operator_delete(local_580[0],local_570[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_538);
  if (local_558 != &local_548) {
    operator_delete(local_558,CONCAT71(uStack_547,local_548) + 1);
  }
  if (local_518[0] != local_508) {
    operator_delete(local_518[0],local_508[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_4f8._M_first);
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_450);
  if (local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_430[0] != local_420) {
    operator_delete(local_430[0],local_420[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_410._M_first);
  if (local_3b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_3b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_3b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_3b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan gettxout()
{
    return RPCHelpMan{"gettxout",
        "\nReturns details about an unspent transaction output.\n",
        {
            {"txid", RPCArg::Type::STR, RPCArg::Optional::NO, "The transaction id"},
            {"n", RPCArg::Type::NUM, RPCArg::Optional::NO, "vout number"},
            {"include_mempool", RPCArg::Type::BOOL, RPCArg::Default{true}, "Whether to include the mempool. Note that an unspent output that is spent in the mempool won't appear."},
        },
        {
            RPCResult{"If the UTXO was not found", RPCResult::Type::NONE, "", ""},
            RPCResult{"Otherwise", RPCResult::Type::OBJ, "", "", {
                {RPCResult::Type::STR_HEX, "bestblock", "The hash of the block at the tip of the chain"},
                {RPCResult::Type::NUM, "confirmations", "The number of confirmations"},
                {RPCResult::Type::STR_AMOUNT, "value", "The transaction value in " + CURRENCY_UNIT},
                {RPCResult::Type::OBJ, "scriptPubKey", "", {
                    {RPCResult::Type::STR, "asm", "Disassembly of the output script"},
                    {RPCResult::Type::STR, "desc", "Inferred descriptor for the output"},
                    {RPCResult::Type::STR_HEX, "hex", "The raw output script bytes, hex-encoded"},
                    {RPCResult::Type::STR, "type", "The type, eg pubkeyhash"},
                    {RPCResult::Type::STR, "address", /*optional=*/true, "The Bitcoin address (only if a well-defined address exists)"},
                }},
                {RPCResult::Type::BOOL, "coinbase", "Coinbase or not"},
            }},
        },
        RPCExamples{
            "\nGet unspent transactions\n"
            + HelpExampleCli("listunspent", "") +
            "\nView the details\n"
            + HelpExampleCli("gettxout", "\"txid\" 1") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("gettxout", "\"txid\", 1")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    ChainstateManager& chainman = EnsureChainman(node);
    LOCK(cs_main);

    UniValue ret(UniValue::VOBJ);

    auto hash{Txid::FromUint256(ParseHashV(request.params[0], "txid"))};
    COutPoint out{hash, request.params[1].getInt<uint32_t>()};
    bool fMempool = true;
    if (!request.params[2].isNull())
        fMempool = request.params[2].get_bool();

    Coin coin;
    Chainstate& active_chainstate = chainman.ActiveChainstate();
    CCoinsViewCache* coins_view = &active_chainstate.CoinsTip();

    if (fMempool) {
        const CTxMemPool& mempool = EnsureMemPool(node);
        LOCK(mempool.cs);
        CCoinsViewMemPool view(coins_view, mempool);
        if (!view.GetCoin(out, coin) || mempool.isSpent(out)) {
            return UniValue::VNULL;
        }
    } else {
        if (!coins_view->GetCoin(out, coin)) {
            return UniValue::VNULL;
        }
    }

    const CBlockIndex* pindex = active_chainstate.m_blockman.LookupBlockIndex(coins_view->GetBestBlock());
    ret.pushKV("bestblock", pindex->GetBlockHash().GetHex());
    if (coin.nHeight == MEMPOOL_HEIGHT) {
        ret.pushKV("confirmations", 0);
    } else {
        ret.pushKV("confirmations", (int64_t)(pindex->nHeight - coin.nHeight + 1));
    }
    ret.pushKV("value", ValueFromAmount(coin.out.nValue));
    UniValue o(UniValue::VOBJ);
    ScriptToUniv(coin.out.scriptPubKey, /*out=*/o, /*include_hex=*/true, /*include_address=*/true);
    ret.pushKV("scriptPubKey", std::move(o));
    ret.pushKV("coinbase", (bool)coin.fCoinBase);

    return ret;
},
    };
}